

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeZ.cpp
# Opt level: O2

void __thiscall OpenMD::ChargeZ::writeChargeZ(ChargeZ *this)

{
  double dVar1;
  int iVar2;
  double *pdVar3;
  double *pdVar4;
  pointer pdVar5;
  char cVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  ostream *poVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ofstream rdfStream;
  
  pdVar4 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar15 = 0.0;
  pdVar3 = (this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar9 = pdVar3; pdVar9 != pdVar4; pdVar9 = pdVar9 + 1) {
    dVar15 = dVar15 + *pdVar9;
  }
  lVar7 = (long)pdVar4 - (long)pdVar3;
  lVar8 = lVar7 >> 3;
  auVar17._8_4_ = (int)(lVar7 >> 0x23);
  auVar17._0_8_ = lVar8;
  auVar17._12_4_ = 0x45300000;
  pdVar4 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar16 = 0.0;
  pdVar3 = (this->areas_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar9 = pdVar3; pdVar9 != pdVar4; pdVar9 = pdVar9 + 1) {
    dVar16 = dVar16 + *pdVar9;
  }
  std::ofstream::ofstream
            (&rdfStream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar6 = std::__basic_file<char>::is_open();
  if (cVar6 == '\0') {
    snprintf(painCave.errMsg,2000,"ChargeZ: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar10 = std::operator<<((ostream *)&rdfStream,"#ChargeZ ");
    std::operator<<(poVar10,"\n");
    poVar10 = std::operator<<((ostream *)&rdfStream,"#selection: (");
    poVar10 = std::operator<<(poVar10,(string *)&this->selectionScript_);
    std::operator<<(poVar10,")\n");
    poVar10 = std::operator<<((ostream *)&rdfStream,"#");
    poVar10 = std::operator<<(poVar10,(string *)&this->axisLabel_);
    std::operator<<(poVar10,"\tcharge\n");
    dVar15 = dVar15 / ((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
    lVar7 = (long)pdVar4 - (long)pdVar3;
    lVar8 = lVar7 >> 3;
    auVar18._8_4_ = (int)(lVar7 >> 0x23);
    auVar18._0_8_ = lVar8;
    auVar18._12_4_ = 0x45300000;
    uVar13 = 0;
    while( true ) {
      uVar14 = (ulong)uVar13;
      pdVar5 = (this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = (long)(this->chargeZ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar5;
      uVar11 = lVar7 >> 3;
      if (uVar11 <= uVar14) break;
      auVar20._8_4_ = (int)(lVar7 >> 0x23);
      auVar20._0_8_ = uVar11;
      auVar20._12_4_ = 0x45300000;
      lVar7 = (long)(this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->zBox_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      dVar1 = pdVar5[uVar14];
      iVar2 = this->nProcessed_;
      poVar10 = std::ostream::_M_insert<double>
                          ((((double)uVar14 + 0.5) * dVar15) /
                           ((auVar20._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)));
      std::operator<<(poVar10,"\t");
      lVar12 = lVar7 >> 3;
      auVar19._8_4_ = (int)(lVar7 >> 0x23);
      auVar19._0_8_ = lVar12;
      auVar19._12_4_ = 0x45300000;
      poVar10 = std::ostream::_M_insert<double>
                          (dVar1 / ((((dVar16 / ((auVar18._8_8_ - 1.9342813113834067e+25) +
                                                ((double)CONCAT44(0x43300000,(int)lVar8) -
                                                4503599627370496.0))) * dVar15) /
                                    ((auVar19._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0))
                                    ) * (double)iVar2));
      std::operator<<(poVar10,"\n");
      uVar13 = uVar13 + 1;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  return;
}

Assistant:

void ChargeZ::writeChargeZ() {
    // compute average box length:
    std::vector<RealType>::iterator j;
    RealType zSum = 0.0;
    for (j = zBox_.begin(); j != zBox_.end(); ++j) {
      zSum += *j;
    }
    RealType zAve = zSum / zBox_.size();

    RealType areaSum = 0.0;
    for (j = areas_.begin(); j != areas_.end(); ++j) {
      areaSum += *j;
    }
    RealType areaAve = areaSum / areas_.size();

    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#ChargeZ "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "#" << axisLabel_ << "\tcharge\n";
      RealType binCharge;
      for (unsigned int i = 0; i < chargeZ_.size(); ++i) {
        RealType z = zAve * (i + 0.5) / chargeZ_.size();

        RealType volSlice = areaAve * zAve / zBox_.size();

        binCharge = chargeZ_[i] / (volSlice * nProcessed_);

        rdfStream << z << "\t" << binCharge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeZ: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }